

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O0

void __thiscall chatter::Protocol::update(Protocol *this,Peer *peer,uint64_t timestamp)

{
  PeerState PVar1;
  Host *pHVar2;
  bool bVar3;
  element_type *peVar4;
  uint64_t time_since_last_rtt;
  undefined1 local_68 [8];
  ptr e_1;
  shared_ptr<chatter::Event> local_48;
  undefined1 local_38 [8];
  ptr e;
  uint64_t time_since_connect;
  uint64_t timestamp_local;
  Peer *peer_local;
  Protocol *this_local;
  
  if ((peer != (Peer *)0x0) && (PVar1 = peer->m_state, PVar1 != DISCONNECTED)) {
    if (PVar1 - CONNECTION_REQUESTED < 3) {
      e.super___shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(timestamp - peer->m_connect_ts);
      if (e.super___shared_ptr<chatter::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1389) {
        do_resends(this,peer,timestamp);
      }
      else {
        if ((peer->m_is_incoming_connection & 1U) == 0) {
          Event::create((Event *)local_38,PEER_UNABLE_TO_CONNECT);
          peVar4 = std::
                   __shared_ptr_access<chatter::Event,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<chatter::Event,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
          (peVar4->address).m_port = (peer->m_address).m_port;
          (peVar4->address).m_address = (peer->m_address).m_address;
          pHVar2 = this->m_host;
          std::shared_ptr<chatter::Event>::shared_ptr
                    (&local_48,(shared_ptr<chatter::Event> *)local_38);
          Host::queue_event(pHVar2,&local_48);
          std::shared_ptr<chatter::Event>::~shared_ptr(&local_48);
          std::shared_ptr<chatter::Event>::~shared_ptr((shared_ptr<chatter::Event> *)local_38);
        }
        Peer::reset(peer);
      }
    }
    else if (PVar1 == CONNECTED) {
      bVar3 = detect_disconnect(this,peer,timestamp);
      if (bVar3) {
        Event::create((Event *)local_68,PEER_TIMED_OUT);
        peVar4 = std::__shared_ptr_access<chatter::Event,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<chatter::Event,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_68);
        (peVar4->address).m_port = (peer->m_address).m_port;
        (peVar4->address).m_address = (peer->m_address).m_address;
        pHVar2 = this->m_host;
        std::shared_ptr<chatter::Event>::shared_ptr
                  ((shared_ptr<chatter::Event> *)&time_since_last_rtt,
                   (shared_ptr<chatter::Event> *)local_68);
        Host::queue_event(pHVar2,(shared_ptr<chatter::Event> *)&time_since_last_rtt);
        std::shared_ptr<chatter::Event>::~shared_ptr
                  ((shared_ptr<chatter::Event> *)&time_since_last_rtt);
        Peer::reset(peer);
        std::shared_ptr<chatter::Event>::~shared_ptr((shared_ptr<chatter::Event> *)local_68);
      }
      if (1000 < timestamp - peer->m_last_rtt_ts) {
        service_rtt(this,peer,timestamp);
      }
      do_resends(this,peer,timestamp);
    }
  }
  return;
}

Assistant:

void Protocol::update(Peer* peer, uint64_t timestamp)
{
    if (!peer)
        return;

    switch (peer->m_state) {
        case PeerState::DISCONNECTED:
            return; /* We shouldn't be given a disconnected peer o.O */

        case PeerState::CONNECTION_REQUESTED:
        case PeerState::CONNECTION_RESPONDED:
        case PeerState::CONNECTION_ACKNOWLEDGED:
            {
                /* Check for long-running connection attempts and kill them */
                uint64_t time_since_connect = timestamp - peer->m_connect_ts;
                if (time_since_connect > kConnectTimeOut) {
                    if (!peer->m_is_incoming_connection) {
                        auto e = Event::create(EventType::PEER_UNABLE_TO_CONNECT);
                        e->address = peer->m_address;
                        m_host->queue_event(e);
                    }
                    peer->reset();
                    return;
                }
                /* Reliable packet re-sends */
                do_resends(peer, timestamp);
            }
            break;

        case PeerState::CONNECTED:
            {
                /* Disconnect detection */
                if (detect_disconnect(peer, timestamp)) {
                    auto e = Event::create(EventType::PEER_TIMED_OUT);
                    e->address = peer->m_address;
                    m_host->queue_event(e);
                    peer->reset();
                }

                /* Keep RTT calculations happening */
                uint64_t time_since_last_rtt = timestamp - peer->m_last_rtt_ts;
                if (time_since_last_rtt > kPingInterval)
                    service_rtt(peer, timestamp);

                /* Reliable packet re-sends */
                do_resends(peer, timestamp);
            }
            break;

        default:
            break;
    }
}